

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O0

int mg_session_read_success_message(mg_session *session,mg_message_success **message)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 *in_RSI;
  mg_session *in_RDI;
  mg_message_success *tmessage;
  int status;
  mg_map *metadata;
  size_t in_stack_ffffffffffffffc8;
  mg_allocator *in_stack_ffffffffffffffd0;
  undefined8 local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = mg_session_read_map((mg_session *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              (mg_map **)in_RDI);
  if (iVar1 == 0) {
    puVar2 = (undefined8 *)mg_allocator_malloc(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (puVar2 == (undefined8 *)0x0) {
      mg_session_set_error(in_RDI,"out of memory");
      mg_map_destroy((mg_map *)0x10a5a4);
      iVar1 = -3;
    }
    else {
      *puVar2 = local_20;
      *in_RSI = puVar2;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mg_session_read_success_message(mg_session *session,
                                    mg_message_success **message) {
  mg_map *metadata;
  MG_RETURN_IF_FAILED(mg_session_read_map(session, &metadata));

  mg_message_success *tmessage = mg_allocator_malloc(
      session->decoder_allocator, sizeof(mg_message_success));
  if (!tmessage) {
    mg_session_set_error(session, "out of memory");
    mg_map_destroy(metadata);
    return MG_ERROR_OOM;
  }
  tmessage->metadata = metadata;
  *message = tmessage;
  return 0;
}